

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_7a016f::RegexMatchAll
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string_view value;
  undefined8 name;
  bool bVar1;
  const_reference s;
  cmMakefile *pcVar2;
  size_type sVar3;
  ulong uVar4;
  allocator local_271;
  string local_270 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  undefined1 local_230 [8];
  string e_1;
  size_type r;
  size_type l;
  char *p;
  string output;
  string local_1c8 [32];
  string_view local_1a8;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_198;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_188;
  undefined1 local_178 [8];
  string input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 local_130 [8];
  string e;
  undefined1 local_100 [8];
  RegularExpression re;
  string *outvar;
  string *regex;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  s = std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](args,2);
  re._200_8_ = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,3);
  pcVar2 = cmExecutionStatus::GetMakefile(status);
  cmMakefile::ClearMatches(pcVar2);
  cmsys::RegularExpression::RegularExpression((RegularExpression *)local_100);
  bVar1 = cmsys::RegularExpression::compile((RegularExpression *)local_100,s);
  if (bVar1) {
    local_198 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          (args);
    local_188 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::advance(&local_198,4);
    std::__cxx11::string::string(local_1c8);
    local_1a8 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_1c8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)((long)&output.field_2 + 8));
    cmJoin((string *)local_178,&local_188,local_1a8,stack0xfffffffffffffe28);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::string::string((string *)&p);
    l = std::__cxx11::string::c_str();
    while( true ) {
      bVar1 = cmsys::RegularExpression::find((RegularExpression *)local_100,(char *)l);
      if (!bVar1) break;
      pcVar2 = cmExecutionStatus::GetMakefile(status);
      cmMakefile::ClearMatches(pcVar2);
      pcVar2 = cmExecutionStatus::GetMakefile(status);
      cmMakefile::StoreMatches(pcVar2,(RegularExpression *)local_100);
      sVar3 = cmsys::RegularExpression::start((RegularExpression *)local_100);
      e_1.field_2._8_8_ = cmsys::RegularExpression::end((RegularExpression *)local_100);
      if (e_1.field_2._8_8_ == sVar3) {
        std::operator+(&local_250,"sub-command REGEX, mode MATCHALL regex \"",s);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_230,&local_250,"\" matched an empty string.");
        std::__cxx11::string::~string((string *)&local_250);
        cmExecutionStatus::SetError(status,(string *)local_230);
        args_local._7_1_ = false;
        input.field_2._12_4_ = 1;
        std::__cxx11::string::~string((string *)local_230);
        goto LAB_00486ee6;
      }
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        std::__cxx11::string::operator+=((string *)&p,";");
      }
      uVar4 = e_1.field_2._8_8_ - sVar3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_270,(char *)(l + sVar3),uVar4,&local_271);
      std::__cxx11::string::operator+=((string *)&p,local_270);
      std::__cxx11::string::~string(local_270);
      std::allocator<char>::~allocator((allocator<char> *)&local_271);
      l = e_1.field_2._8_8_ + l;
    }
    pcVar2 = cmExecutionStatus::GetMakefile(status);
    name = re._200_8_;
    value = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)&p);
    cmMakefile::AddDefinition(pcVar2,(string *)name,value);
    args_local._7_1_ = true;
    input.field_2._12_4_ = 1;
LAB_00486ee6:
    std::__cxx11::string::~string((string *)&p);
    std::__cxx11::string::~string((string *)local_178);
  }
  else {
    std::operator+(&local_150,"sub-command REGEX, mode MATCHALL failed to compile regex \"",s);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                   &local_150,"\".");
    std::__cxx11::string::~string((string *)&local_150);
    cmExecutionStatus::SetError(status,(string *)local_130);
    args_local._7_1_ = false;
    input.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_130);
  }
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_100);
  return args_local._7_1_;
}

Assistant:

bool RegexMatchAll(std::vector<std::string> const& args,
                   cmExecutionStatus& status)
{
  //"STRING(REGEX MATCHALL <regular_expression> <output variable> <input>
  // [<input>...])\n";
  std::string const& regex = args[2];
  std::string const& outvar = args[3];

  status.GetMakefile().ClearMatches();
  // Compile the regular expression.
  cmsys::RegularExpression re;
  if (!re.compile(regex)) {
    std::string e =
      "sub-command REGEX, mode MATCHALL failed to compile regex \"" + regex +
      "\".";
    status.SetError(e);
    return false;
  }

  // Concatenate all the last arguments together.
  std::string input = cmJoin(cmMakeRange(args).advance(4), std::string());

  // Scan through the input for all matches.
  std::string output;
  const char* p = input.c_str();
  while (re.find(p)) {
    status.GetMakefile().ClearMatches();
    status.GetMakefile().StoreMatches(re);
    std::string::size_type l = re.start();
    std::string::size_type r = re.end();
    if (r - l == 0) {
      std::string e = "sub-command REGEX, mode MATCHALL regex \"" + regex +
        "\" matched an empty string.";
      status.SetError(e);
      return false;
    }
    if (!output.empty()) {
      output += ";";
    }
    output += std::string(p + l, r - l);
    p += r;
  }

  // Store the output in the provided variable.
  status.GetMakefile().AddDefinition(outvar, output);
  return true;
}